

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

void run_benchmark(testing t)

{
  int iVar1;
  char *__ptr;
  char *__ptr_00;
  char *pcVar2;
  bool bVar3;
  nsync_time nVar4;
  __time_t local_50;
  __syscall_slong_t local_48;
  int local_40;
  int32_t mul;
  int longshort;
  double target;
  double dStack_28;
  int n;
  double elapsed;
  char *time_per_op_str;
  char *elapsed_str;
  testing t_local;
  
  target._4_4_ = 1;
  _mul = 2.0;
  iVar1 = testing_longshort(t);
  if (iVar1 < 0) {
    _mul = (double)(2000 >> (-(byte)iVar1 & 0x1f)) * 0.001;
  }
  else if (0 < iVar1) {
    _mul = (double)(2000 << ((byte)iVar1 & 0x1f)) * 0.001;
  }
  do {
    t->test_status = 0;
    t->n = target._4_4_;
    (t->stop_time).tv_sec = 0;
    (t->stop_time).tv_nsec = 0;
    nVar4 = nsync::nsync_time_now();
    local_50 = nVar4.tv_sec;
    (t->start_time).tv_sec = local_50;
    local_48 = nVar4.tv_nsec;
    (t->start_time).tv_nsec = local_48;
    (*t->f)(t);
    nVar4 = nsync::nsync_time_now();
    nVar4 = nsync::nsync_time_sub(nVar4,t->start_time);
    dStack_28 = nsync_time_to_dbl(nVar4);
    if (dStack_28 < 0.1) {
      dStack_28 = 0.1;
    }
    for (local_40 = (int)(_mul / dStack_28); dStack_28 * (double)local_40 * 4.0 < _mul * 5.0;
        local_40 = local_40 + 1) {
    }
    if (((local_40 < 2) || (_mul * 3.0 <= dStack_28 * (double)local_40 * 2.0)) ||
       ((int)(0x7fffffff / (long)local_40) <= target._4_4_)) {
      if (target._4_4_ < 0x3fffffff) {
        target._4_4_ = target._4_4_ << 1;
      }
    }
    else {
      target._4_4_ = local_40 * target._4_4_;
    }
    bVar3 = false;
    if ((t->test_status == 0) && (bVar3 = false, dStack_28 < _mul)) {
      bVar3 = target._4_4_ != t->n;
    }
  } while (bVar3);
  nVar4 = nsync_time_from_dbl(dStack_28);
  __ptr = nsync_time_str(nVar4,2);
  nVar4 = nsync_time_from_dbl(dStack_28 / (double)t->n);
  __ptr_00 = nsync_time_str(nVar4,2);
  pcVar2 = "";
  if (t->test_status != 0) {
    pcVar2 = "  *** failed ***";
  }
  fprintf((FILE *)t->fp,"%-50s %9d %8s  %8.2g %8s%s\n",(double)t->n / dStack_28,t->name,
          (ulong)(uint)t->n,__ptr,__ptr_00,pcVar2);
  free(__ptr);
  free(__ptr_00);
  finish_run(t);
  return;
}

Assistant:

static void run_benchmark (testing t) {
	char *elapsed_str = 0;
	char *time_per_op_str = 0;
	double elapsed;
	int n = 1;
	double target = 2.0;
	int longshort = testing_longshort (t);
	if (longshort < 0) {
		target = 1e-3 * (2000 >> -longshort);
	} else if (longshort > 0) {
		target = 1e-3 * (2000 << longshort);
	}
	do {
		int32_t mul;
		t->test_status = 0;
		t->n = n;
		t->stop_time = nsync_time_zero;
		t->start_time = nsync_time_now ();
		(*t->f) (t);
		elapsed = nsync_time_to_dbl (nsync_time_sub (nsync_time_now (), t->start_time));
		if (elapsed < 1e-1) {
			elapsed = 1e-1;
		}
		mul = (int32_t) (target / elapsed);
		while (elapsed * mul * 4 < target * 5) {
			mul++;
		}
		if (mul > 1 && elapsed * mul * 2 < target * 3 && n < INT_MAX / mul) {
			n *= mul;
		} else if (n < INT_MAX / 2) {
			n *= 2;
		}
	} while (t->test_status == 0 && elapsed < target && n != t->n);
	elapsed_str = nsync_time_str (nsync_time_from_dbl (elapsed), 2);
	time_per_op_str = nsync_time_str (nsync_time_from_dbl (elapsed / t->n), 2);
	fprintf (t->fp, "%-50s %9d %8s  %8.2g %8s%s\n", t->name, t->n, elapsed_str,
		 ((double)t->n) / elapsed, time_per_op_str,
		 t->test_status != 0 ? "  *** failed ***" : "");
	free (elapsed_str);
	free (time_per_op_str);
	finish_run (t);
}